

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O3

void __thiscall UnitTest_parser_exp2::Run(UnitTest_parser_exp2 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  string local_48;
  long *local_28;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a = 1 + 2 + 3 * 4","");
  io::text::InStringStream::SetInputString
            ((InStringStream *)(anonymous_namespace)::g_parser,&local_48);
  luna::Parse((luna *)&local_28,(Lexer *)((anonymous_namespace)::g_parser + 0xd0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)&PTR__Visitor_001861a8;
  local_48._M_string_length = 0;
  (**(code **)(*local_28 + 0x10))(local_28,&local_48,0);
  sVar2 = local_48._M_string_length;
  plVar3 = *(long **)(local_48._M_string_length + 8);
  if (*(long *)(local_48._M_string_length + 0x10) - (long)plVar3 != 8) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'exp_list->exp_list_.size() == 1\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    plVar3 = *(long **)(sVar2 + 8);
  }
  if (*plVar3 == 0) {
LAB_00138c0f:
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\'bin_exp\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(*plVar3,&luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,0);
    if (lVar4 == 0) goto LAB_00138c0f;
  }
  if (*(int *)(lVar4 + 0x30) != 0x2b) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'bin_exp->op_token_.token_ == \'+\'\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (*(long *)(lVar4 + 8) == 0) {
LAB_00138ca3:
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\'left\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar4 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
    if (lVar5 == 0) goto LAB_00138ca3;
  }
  if (*(int *)(lVar5 + 0x30) != 0x2b) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'left->op_token_.token_ == \'+\'\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (*(long *)(lVar5 + 8) == 0) {
LAB_00138d34:
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'dynamic_cast<luna::Terminator *>(left->left_.get())\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    lVar6 = __dynamic_cast(*(long *)(lVar5 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar6 == 0) goto LAB_00138d34;
  }
  if (*(long *)(lVar5 + 0x10) == 0) {
LAB_00138d89:
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'dynamic_cast<luna::Terminator *>(left->right_.get())\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar5 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar5 == 0) goto LAB_00138d89;
  }
  if (*(long *)(lVar4 + 0x10) == 0) {
LAB_00138de1:
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\'right\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(*(long *)(lVar4 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
    if (lVar4 == 0) goto LAB_00138de1;
  }
  if (*(int *)(lVar4 + 0x30) != 0x2a) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'right->op_token_.token_ == \'*\'\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (*(long *)(lVar4 + 8) == 0) {
LAB_00138e72:
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"\'dynamic_cast<luna::Terminator *>(right->left_.get())\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar4 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar5 == 0) goto LAB_00138e72;
  }
  if (*(long *)(lVar4 + 0x10) != 0) {
    lVar4 = __dynamic_cast(*(long *)(lVar4 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar4 != 0) goto LAB_00138ef9;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"\'dynamic_cast<luna::Terminator *>(right->right_.get())\'","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
LAB_00138ef9:
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return;
}

Assistant:

TEST_CASE(parser_exp2)
{
    auto root = Parse("a = 1 + 2 + 3 * 4");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');

    // 1 + 2
    auto left = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // 3 * 4
    auto right = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '*');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->right_.get()));
}